

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTest.cpp
# Opt level: O3

void __thiscall DOMTest::findTestNodes(DOMTest *this,DOMNode *node)

{
  undefined4 uVar1;
  long lVar2;
  DOMNode *pDVar3;
  DOMNode *pDVar4;
  
  lVar2 = (**(code **)(*(long *)node + 0x38))(node);
  if (lVar2 != 0) {
    pDVar4 = node;
    pDVar3 = (DOMNode *)(**(code **)(*(long *)node + 0x38))();
    findTestNodes((DOMTest *)pDVar4,pDVar3);
  }
  lVar2 = (**(code **)(*(long *)node + 0x50))(node);
  if (lVar2 != 0) {
    pDVar4 = node;
    pDVar3 = (DOMNode *)(**(code **)(*(long *)node + 0x50))();
    findTestNodes((DOMTest *)pDVar4,pDVar3);
  }
  uVar1 = (**(code **)(*(long *)node + 0x20))(node);
  switch(uVar1) {
  case 1:
    if (testElementNode == (DOMElement *)0x0) {
      testElementNode = (DOMElement *)node;
    }
    break;
  case 2:
    if (testAttributeNode == (DOMAttr *)0x0) {
      testAttributeNode = (DOMAttr *)node;
    }
    break;
  case 3:
    if (testTextNode == (DOMText *)0x0) {
      testTextNode = (DOMText *)node;
    }
    break;
  case 4:
    if (testCDATASectionNode == (DOMCDATASection *)0x0) {
      testCDATASectionNode = (DOMCDATASection *)node;
    }
    break;
  case 5:
    if (testEntityReferenceNode == (DOMEntityReference *)0x0) {
      testEntityReferenceNode = (DOMEntityReference *)node;
    }
    break;
  case 6:
    if (testEntityNode == (DOMEntity *)0x0) {
      testEntityNode = (DOMEntity *)node;
    }
    break;
  case 7:
    if (testProcessingInstructionNode == (DOMProcessingInstruction *)0x0) {
      testProcessingInstructionNode = (DOMProcessingInstruction *)node;
    }
    break;
  case 8:
    if (testCommentNode == (DOMComment *)0x0) {
      testCommentNode = (DOMComment *)node;
    }
    break;
  case 9:
    if (testDocumentNode == (DOMDocument *)0x0) {
      testDocumentNode = (DOMDocument *)(node + -0x18);
    }
    break;
  case 10:
    if (testDocumentTypeNode == (DOMDocumentType *)0x0) {
      testDocumentTypeNode = (DOMDocumentType *)node;
    }
    break;
  case 0xb:
    if (testDocumentFragmentNode == (DOMDocumentFragment *)0x0) {
      testDocumentFragmentNode = (DOMDocumentFragment *)node;
    }
    break;
  case 0xc:
    if (testNotationNode == (DOMNotation *)0x0) {
      testNotationNode = (DOMNotation *)node;
    }
  }
  return;
}

Assistant:

void DOMTest::findTestNodes(DOMNode* node) {
    DOMTest test;
    DOMNode*  kid;
    // Walk the tree until you find and assign all node types needed that exist.


    if (node->getFirstChild() != 0)
    {
        kid = node->getFirstChild();
        test.findTestNodes(kid);
    }


    if (node->getNextSibling() != 0)
    {
        kid = node->getNextSibling();
        test.findTestNodes(kid);
    }


    switch (node->getNodeType())
    {
        case DOMNode::ELEMENT_NODE :
            if (testElementNode == 0) {testElementNode = (DOMElement*)node; }
            break;
        case DOMNode::ATTRIBUTE_NODE :
            if (testAttributeNode == 0) {testAttributeNode = (DOMAttr*)node; }
            break;
        case DOMNode::TEXT_NODE :
            if (testTextNode == 0) {testTextNode = (DOMText*)node; }
            break;
        case DOMNode::CDATA_SECTION_NODE :
            if (testCDATASectionNode == 0) {testCDATASectionNode = (DOMCDATASection*)node; }
            break;
        case DOMNode::ENTITY_REFERENCE_NODE :
            if (testEntityReferenceNode == 0) {testEntityReferenceNode = (DOMEntityReference*)node;}
            break;
        case DOMNode::ENTITY_NODE :
            if (testEntityNode == 0) {testEntityNode = (DOMEntity*)node;}
            break;
        case DOMNode::PROCESSING_INSTRUCTION_NODE :
            if (testProcessingInstructionNode == 0) {testProcessingInstructionNode = (DOMProcessingInstruction*)node;}
            break;
        case DOMNode::COMMENT_NODE :
            if (testCommentNode == 0) {testCommentNode = (DOMComment*)node;}
            break;
        case DOMNode::DOCUMENT_TYPE_NODE :
            if (testDocumentTypeNode == 0) {testDocumentTypeNode = (DOMDocumentType*)node; }
            break;
        case DOMNode::DOCUMENT_FRAGMENT_NODE :
            if (testDocumentFragmentNode == 0) {testDocumentFragmentNode = (DOMDocumentFragment*)node;}
            break;
        case DOMNode::NOTATION_NODE :
            if (testNotationNode == 0) {testNotationNode = (DOMNotation*)node;}
            break;
        case DOMNode::DOCUMENT_NODE :
            if (testDocumentNode == 0) {testDocumentNode = (DOMDocument*)node;}
            break;
        default:
            ;
    }// End of switch
}